

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ImageFeatureType::ImageFeatureType
          (ImageFeatureType *this,ImageFeatureType *from)

{
  SizeFlexibilityCase SVar1;
  InternalMetadataWithArenaLite *this_00;
  ImageFeatureType_EnumeratedImageSizes *this_01;
  ImageFeatureType_EnumeratedImageSizes *from_00;
  ImageFeatureType_ImageSizeRange *this_02;
  ImageFeatureType_ImageSizeRange *from_01;
  ImageFeatureType *from_local;
  ImageFeatureType *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ImageFeatureType_0056a4d8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  SizeFlexibilityUnion::SizeFlexibilityUnion((SizeFlexibilityUnion *)&this->SizeFlexibility_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  memcpy(&this->width_,&from->width_,(long)this + (0x24 - (long)&this->width_));
  clear_has_SizeFlexibility(this);
  SVar1 = SizeFlexibility_case(from);
  if (SVar1 != SIZEFLEXIBILITY_NOT_SET) {
    if (SVar1 == kEnumeratedSizes) {
      this_01 = mutable_enumeratedsizes(this);
      from_00 = enumeratedsizes(from);
      ImageFeatureType_EnumeratedImageSizes::MergeFrom(this_01,from_00);
    }
    else if (SVar1 == kImageSizeRange) {
      this_02 = mutable_imagesizerange(this);
      from_01 = imagesizerange(from);
      ImageFeatureType_ImageSizeRange::MergeFrom(this_02,from_01);
    }
  }
  return;
}

Assistant:

ImageFeatureType::ImageFeatureType(const ImageFeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&width_, &from.width_,
    reinterpret_cast<char*>(&colorspace_) -
    reinterpret_cast<char*>(&width_) + sizeof(colorspace_));
  clear_has_SizeFlexibility();
  switch (from.SizeFlexibility_case()) {
    case kEnumeratedSizes: {
      mutable_enumeratedsizes()->::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes::MergeFrom(from.enumeratedsizes());
      break;
    }
    case kImageSizeRange: {
      mutable_imagesizerange()->::CoreML::Specification::ImageFeatureType_ImageSizeRange::MergeFrom(from.imagesizerange());
      break;
    }
    case SIZEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ImageFeatureType)
}